

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.c
# Opt level: O2

IXML_Attr * ixmlNode_cloneAttr(IXML_Attr *nodeptr)

{
  int iVar1;
  IXML_Attr *attr;
  
  attr = (IXML_Attr *)malloc(0x80);
  if (attr != (IXML_Attr *)0x0) {
    ixmlAttr_init(attr);
    iVar1 = ixmlNode_setNodeName((IXML_Node_conflict *)attr,(nodeptr->n).nodeName);
    if ((((iVar1 == 0) &&
         (iVar1 = ixmlNode_setNodeValue((IXML_Node_conflict *)attr,(nodeptr->n).nodeValue),
         iVar1 == 0)) &&
        (iVar1 = ixmlNode_setNamespaceURI((IXML_Node_conflict *)attr,(nodeptr->n).namespaceURI),
        iVar1 == 0)) &&
       ((iVar1 = ixmlNode_setPrefix((IXML_Node_conflict *)attr,(nodeptr->n).prefix), iVar1 == 0 &&
        (iVar1 = ixmlNode_setLocalName((IXML_Node_conflict *)attr,(nodeptr->n).localName),
        iVar1 == 0)))) {
      (attr->n).nodeType = eATTRIBUTE_NODE;
      return attr;
    }
    ixmlAttr_free(attr);
  }
  return (IXML_Attr *)0x0;
}

Assistant:

static IXML_Attr *ixmlNode_cloneAttr(
	/*! [in] The \b Node to clone. */
	IXML_Attr *nodeptr)
{
	IXML_Attr *newAttr;
	IXML_Node *attrNode;
	IXML_Node *srcNode;
	int rc;

	assert(nodeptr != NULL);

	newAttr = (IXML_Attr *)malloc(sizeof(IXML_Attr));
	if (newAttr == NULL) {
		return NULL;
	}

	ixmlAttr_init(newAttr);
	attrNode = (IXML_Node *)newAttr;
	srcNode = (IXML_Node *)nodeptr;

	rc = ixmlNode_setNodeName(attrNode, srcNode->nodeName);
	if (rc != IXML_SUCCESS) {
		ixmlAttr_free(newAttr);
		return NULL;
	}

	rc = ixmlNode_setNodeValue(attrNode, srcNode->nodeValue);
	if (rc != IXML_SUCCESS) {
		ixmlAttr_free(newAttr);
		return NULL;
	}

	/* Check to see whether we need to split prefix and localname for
	 * attribute */
	rc = ixmlNode_setNamespaceURI(attrNode, srcNode->namespaceURI);
	if (rc != IXML_SUCCESS) {
		ixmlAttr_free(newAttr);
		return NULL;
	}

	rc = ixmlNode_setPrefix(attrNode, srcNode->prefix);
	if (rc != IXML_SUCCESS) {
		ixmlAttr_free(newAttr);
		return NULL;
	}

	rc = ixmlNode_setLocalName(attrNode, srcNode->localName);
	if (rc != IXML_SUCCESS) {
		ixmlAttr_free(newAttr);
		return NULL;
	}

	attrNode->nodeType = eATTRIBUTE_NODE;

	return newAttr;
}